

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void sendTempo(State *state)

{
  double quantum;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  UdpSender *this;
  microseconds time;
  long lVar5;
  ostream *poVar6;
  OutboundPacketStream *pOVar7;
  char *packet;
  size_t sVar8;
  OutboundPacketStream p;
  Timeline timeline;
  char buffer [1024];
  BeginMessage local_490;
  OutboundPacketStream local_488;
  Timeline local_450;
  Clock<1> local_418 [1032];
  
  ableton::Link::captureAppTimeline(&local_450,&state->link);
  quantum = state->quantum;
  time = ableton::platforms::linux::Clock<1>::micros(local_418);
  dVar1 = ableton::Link::Timeline::beatAtTime(&local_450,time,quantum);
  ableton::Link::Timeline::phaseAtTime(&local_450,time,quantum);
  if (sendTempo::diff == 0) {
    lVar5 = std::chrono::_V2::system_clock::now();
    sendTempo::diff = ((lVar5 / 1000000) * 1000 - time.__r) + 500;
  }
  dVar2 = (double)(sendTempo::diff + time.__r) / 1000000.0 + -0.2;
  dVar3 = floor(dVar2);
  dVar2 = floor((dVar2 - (double)(int)dVar3) * 1000000.0);
  osc::OutboundPacketStream::OutboundPacketStream(&local_488,(char *)local_418,0x400);
  std::operator<<((ostream *)&std::cout,"\nnew cps: ");
  dVar4 = ((double)local_450.mTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                   super__Head_base<0UL,_double,_false>._M_head_impl / quantum) / 60.0;
  poVar6 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar6," | last cps: ");
  poVar6 = std::ostream::_M_insert<double>(sendTempo::last_cps);
  std::operator<<(poVar6,"\n");
  local_490.addressPattern = "/tempo";
  sendTempo::last_cps = dVar4;
  pOVar7 = osc::OutboundPacketStream::operator<<(&local_488,&local_490);
  pOVar7 = osc::OutboundPacketStream::operator<<(pOVar7,(int)dVar3);
  pOVar7 = osc::OutboundPacketStream::operator<<(pOVar7,(int)dVar2);
  pOVar7 = osc::OutboundPacketStream::operator<<(pOVar7,(float)(dVar1 / quantum));
  pOVar7 = osc::OutboundPacketStream::operator<<(pOVar7,(float)dVar4);
  pOVar7 = osc::OutboundPacketStream::operator<<(pOVar7,"True");
  osc::OutboundPacketStream::operator<<(pOVar7,(MessageTerminator *)&osc::EndMessage);
  this = sender;
  packet = osc::OutboundPacketStream::Data(&local_488);
  sVar8 = osc::OutboundPacketStream::Size(&local_488);
  UdpSender::Send(this,packet,(int)sVar8);
  osc::OutboundPacketStream::~OutboundPacketStream(&local_488);
  return;
}

Assistant:

void sendTempo(State& state) {
  auto timeline = state.link.captureAppTimeline();
  auto quantum = state.quantum;
  const auto time = state.link.clock().micros();
  const auto tempo = timeline.tempo();
  const auto beats = timeline.beatAtTime(time, quantum);
  const auto phase = timeline.phaseAtTime(time, quantum);
  const auto cycle = beats / quantum;
  const double cps = (timeline.tempo() / quantum) / 60;
  const auto t     = std::chrono::microseconds(time).count();
  static long diff = 0;
  static double last_cps = -1;
  char buffer[OUTPUT_BUFFER_SIZE];
  if (diff == 0) {
    unsigned long milliseconds_since_epoch = 
      std::chrono::duration_cast<std::chrono::milliseconds>
      (std::chrono::system_clock::now().time_since_epoch()).count();
    // POSIX is millis and Link is micros.. Not sure if that `+500` helps
    diff = ((milliseconds_since_epoch*1000 + 500) - t);
  }
  double timetag_ut = ((double) (t + diff)) / ((double) 1000000);
  // latency hack
  timetag_ut -= 0.2;
  int sec = floor(timetag_ut);
  int usec = floor(1000000 * (timetag_ut - sec));
  osc::OutboundPacketStream p( buffer, OUTPUT_BUFFER_SIZE );
  std::cout << "\nnew cps: " << cps << " | last cps: " << last_cps << "\n";
  last_cps = cps;
  p << osc::BeginMessage( "/tempo" )
    << sec << usec
    << (float) cycle << (float) cps << "True" << osc::EndMessage;
  //s.Send( p.Data(), p.Size() );
  sender->Send((char *)p.Data(), p.Size());
}